

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O0

void ronanCBProcess(syWRonan *wsptr,float *buf,uint32_t len)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int local_cc;
  int r;
  float lin;
  float out;
  float in;
  uint32_t i_2;
  float *dest_1;
  float *src;
  uint local_a0;
  uint32_t i_1;
  uint32_t i;
  float mul;
  float *dest;
  float *src2;
  float *src1;
  syVRonan deltaframe;
  uint32_t len_local;
  float *buf_local;
  syWRonan *wsptr_local;
  
  for (local_a0 = 0; local_a0 < 0x19; local_a0 = local_a0 + 1) {
    *(float *)((long)deltaframe.rdef + (ulong)local_a0 * 4 + -8) =
         ((&(wsptr->newframe).rdef[0].a)[local_a0] - (&(wsptr->super_syVRonan).rdef[0].a)[local_a0])
         * (1.0 / (float)len);
  }
  deltaframe.a_frication = (float)len;
  unique0x100002da = buf;
  for (src._4_4_ = 0.0; (uint)src._4_4_ < (uint)deltaframe.a_frication;
      src._4_4_ = (float)((int)src._4_4_ + 1)) {
    for (out = 0.0; (uint)out < 0x19; out = (float)((int)out + 1)) {
      (&(wsptr->super_syVRonan).rdef[0].a)[(uint)out] =
           *(float *)((long)deltaframe.rdef + (ulong)(uint)out * 4 + -8) +
           (&(wsptr->super_syVRonan).rdef[0].a)[(uint)out];
    }
    fVar2 = stack0xffffffffffffffe8[(uint)((int)src._4_4_ << 1)];
    fVar3 = (wsptr->super_syVRonan).a_voicing;
    fVar1 = Ronan::syWRonan::noise(wsptr);
    fVar2 = fVar2 * fVar3 + fVar1 * (wsptr->super_syVRonan).a_aspiration;
    fVar3 = Ronan::Resonator::tick(wsptr->res,fVar2);
    fVar1 = Ronan::Resonator::tick(wsptr->res + 1,fVar2);
    r = (int)(fVar3 + fVar1);
    fVar3 = Ronan::syWRonan::noise(wsptr);
    fVar3 = (fVar3 * (wsptr->super_syVRonan).a_frication + fVar2) - wsptr->lastin2;
    wsptr->lastin2 = fVar2;
    for (local_cc = 2; local_cc < 7; local_cc = local_cc + 1) {
      fVar2 = Ronan::Resonator::tick(wsptr->res + local_cc,fVar3);
      r = (int)(fVar2 - (float)r);
    }
    fVar2 = (fVar3 * (wsptr->super_syVRonan).a_bypass + -(float)r) - wsptr->hpb1;
    wsptr->hpb1 = fVar2 * 0.012 + wsptr->hpb1;
    fVar2 = fVar2 - wsptr->hpb2;
    wsptr->hpb2 = fVar2 * 0.012 + wsptr->hpb2;
    fVar3 = Ronan::Resonator::tick(&wsptr->peq1,fVar2);
    stack0xffffffffffffffe8[(int)src._4_4_ * 2 + 1] = fVar3 - fVar2;
    stack0xffffffffffffffe8[(uint)((int)src._4_4_ << 1)] = fVar3 - fVar2;
  }
  return;
}

Assistant:

void ronanCBProcess(syWRonan *wsptr, float *buf, uint32_t len)
{
    syVRonan deltaframe;

    // prepare interpolation
    {
        float *src1 = (float*)wsptr;
        float *src2 = (float*)&wsptr->newframe;
        float *dest = (float*)&deltaframe;
        float mul   = 1.0f/(float)len;
        for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
            dest[i] = (src2[i] - src1[i])*mul;
    }

    for (uint32_t i = 0; i < len; i++)
    {
        // interpolate all values
        {
            float *src  = (float*)&deltaframe;
            float *dest = (float*)wsptr;
            for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
                dest[i] += src[i];
        }

        float in = buf[2*i];

        // add aspiration noise
        in = in*wsptr->a_voicing + wsptr->noise()*wsptr->a_aspiration;

        // process complete input signal with f1/nasal filters
        float out = wsptr->res[0].tick(in) + wsptr->res[1].tick(in);

        // differentiate input signal, add frication noise
        float lin = in;
        in = (wsptr->noise()*wsptr->a_frication) + in - wsptr->lastin2;
        wsptr->lastin2 = lin;

        // process diff/fric input signal with f2..f6 and bypass (phase inverted)
        for (int r = 2; r < 7; r++)
            out = wsptr->res[r].tick(in) - out;

        out = in*wsptr->a_bypass - out;

        // high pass filter
        wsptr->hpb1 += 0.012f*(out = out - wsptr->hpb1);
        wsptr->hpb2 += 0.012f*(out = out - wsptr->hpb2);

        // EQ
        out = wsptr->peq1.tick(out) - out;

        buf[2*i] = buf[2*i + 1] = out;
    }
}